

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void __thiscall Draw::PrintNumAlignCenter(Draw *this,int num,int w,bool Zero)

{
  ulong uVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  if (num == 0 && !Zero) {
    iVar4 = 0;
    if (0 < w) {
      iVar4 = w;
    }
    while (iVar4 != 0) {
      std::operator<<((ostream *)&std::cout,' ');
      iVar4 = iVar4 + -1;
    }
  }
  else {
    iVar4 = 0;
    for (uVar1 = (ulong)(uint)num; (int)uVar1 != 0; uVar1 = (long)(int)uVar1 / 10) {
      iVar4 = iVar4 + 1;
    }
    iVar5 = 1;
    if (num != 0) {
      iVar5 = iVar4;
    }
    if (w < iVar5) {
      poVar3 = std::operator<<((ostream *)&std::cout,"ERROR");
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
    uVar1 = (long)(w - iVar5) / 2;
    iVar2 = (int)uVar1;
    iVar5 = (w - iVar5) - iVar2;
    iVar4 = 0;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    while (iVar4 != 0) {
      std::operator<<((ostream *)&std::cout,' ');
      iVar4 = iVar4 + -1;
    }
    std::ostream::operator<<((ostream *)&std::cout,num);
    uVar6 = 0;
    if (0 < iVar2) {
      uVar6 = uVar1 & 0xffffffff;
    }
    while (iVar4 = (int)uVar6, uVar6 = (ulong)(iVar4 - 1), iVar4 != 0) {
      std::operator<<((ostream *)&std::cout,' ');
    }
  }
  return;
}

Assistant:

void Draw::PrintNumAlignCenter(int num, int w, bool Zero) {
    if (num == 0 && !Zero) {
        for (int i = 0; i < w; i++)
            std::cout << ' ';
        return;
    }
    int len = 0, tnum = num;
    while (tnum) {
        tnum /= 10;
        len++;
    }
    if (num == 0)
        len = 1;
    if (w < len) {
        std::cout << "ERROR" << std::endl;
        return;
    }
    w -= len;
    for (int i = 0; i < w - w / 2; i++)
        std::cout << ' ';
    std::cout << num;
    for (int i = 0; i < w / 2; i++)
        std::cout << ' ';
}